

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImVec2 ImGui::TabItemCalcSize(char *label,bool has_close_button)

{
  ImGuiContext *pIVar1;
  float fVar2;
  float rhs;
  ImVec2 local_38;
  ImVec2 size;
  ImVec2 label_size;
  ImGuiContext *g;
  bool has_close_button_local;
  char *label_local;
  
  pIVar1 = GImGui;
  size = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar2 = (pIVar1->Style).FramePadding.y;
  ImVec2::ImVec2(&local_38,size.x + (pIVar1->Style).FramePadding.x,fVar2 + fVar2 + size.y);
  if (has_close_button) {
    fVar2 = (pIVar1->Style).FramePadding.x + (pIVar1->Style).ItemInnerSpacing.x + pIVar1->FontSize;
  }
  else {
    fVar2 = (pIVar1->Style).FramePadding.x + 1.0;
  }
  local_38.x = fVar2 + local_38.x;
  fVar2 = local_38.x;
  rhs = TabBarCalcMaxTabWidth();
  fVar2 = ImMin<float>(fVar2,rhs);
  ImVec2::ImVec2((ImVec2 *)&label_local,fVar2,local_38.y);
  return (ImVec2)label_local;
}

Assistant:

ImVec2 ImGui::TabItemCalcSize(const char* label, bool has_close_button)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    ImVec2 size = ImVec2(label_size.x + g.Style.FramePadding.x, label_size.y + g.Style.FramePadding.y * 2.0f);
    if (has_close_button)
        size.x += g.Style.FramePadding.x + (g.Style.ItemInnerSpacing.x + g.FontSize); // We use Y intentionally to fit the close button circle.
    else
        size.x += g.Style.FramePadding.x + 1.0f;
    return ImVec2(ImMin(size.x, TabBarCalcMaxTabWidth()), size.y);
}